

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O0

bool Assimp::Ogre::EndsWith(string *s,string *suffix,bool caseSensitive)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_e0 [8];
  string sSuffix;
  size_t len;
  string local_98;
  string local_68;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool caseSensitive_local;
  string *suffix_local;
  string *s_local;
  
  local_21 = caseSensitive;
  psStack_20 = suffix;
  suffix_local = s;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar3 = std::__cxx11::string::length();
      uVar4 = std::__cxx11::string::length();
      if (uVar3 < uVar4) {
        s_local._7_1_ = 0;
      }
      else if ((local_21 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_68,(string *)suffix_local);
        ToLower(&local_48,&local_68);
        std::__cxx11::string::string((string *)&len,(string *)psStack_20);
        ToLower(&local_98,(string *)&len);
        s_local._7_1_ = EndsWith(&local_48,&local_98,true);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&len);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
      }
      else {
        sSuffix.field_2._8_8_ = std::__cxx11::string::length();
        psVar1 = suffix_local;
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_e0,(ulong)psVar1);
        iVar2 = ASSIMP_stricmp((string *)local_e0,psStack_20);
        s_local._7_1_ = iVar2 == 0;
        std::__cxx11::string::~string((string *)local_e0);
      }
      goto LAB_0073b27d;
    }
  }
  s_local._7_1_ = 0;
LAB_0073b27d:
  return (bool)(s_local._7_1_ & 1);
}

Assistant:

static AI_FORCE_INLINE
bool EndsWith(const std::string &s, const std::string &suffix, bool caseSensitive = true) {
    if (s.empty() || suffix.empty()) {
        return false;
    } else if (s.length() < suffix.length()) {
        return false;
    }

    if (!caseSensitive) {
        return EndsWith(ToLower(s), ToLower(suffix), true);
    }

    size_t len = suffix.length();
    std::string sSuffix = s.substr(s.length()-len, len);

    return (ASSIMP_stricmp(sSuffix, suffix) == 0);
}